

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zetMetricTracerCreateExp
          (zet_context_handle_t hContext,zet_device_handle_t hDevice,uint32_t metricGroupCount,
          zet_metric_group_handle_t *phMetricGroups,zet_metric_tracer_exp_desc_t *desc,
          ze_event_handle_t hNotificationEvent,zet_metric_tracer_exp_handle_t *phMetricTracer)

{
  code *pcVar1;
  ulong uVar2;
  void *pvVar3;
  object_t<_zet_metric_tracer_exp_handle_t_*> *poVar4;
  undefined8 local_90;
  bad_alloc *anon_var_0;
  ulong local_68;
  size_t i;
  zet_metric_group_handle_t *phMetricGroupsLocal;
  zet_pfnMetricTracerCreateExp_t pfnCreateExp;
  dditable_t *dditable;
  ze_event_handle_t p_Stack_40;
  ze_result_t result;
  ze_event_handle_t hNotificationEvent_local;
  zet_metric_tracer_exp_desc_t *desc_local;
  zet_metric_group_handle_t *phMetricGroups_local;
  undefined8 uStack_20;
  uint32_t metricGroupCount_local;
  zet_device_handle_t hDevice_local;
  zet_context_handle_t hContext_local;
  
  dditable._4_4_ = 0;
  pfnCreateExp = *(zet_pfnMetricTracerCreateExp_t *)(hContext + 8);
  pcVar1 = *(code **)(pfnCreateExp + 0x678);
  if (pcVar1 == (code *)0x0) {
    hContext_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hDevice_local = *(zet_device_handle_t *)hContext;
    uStack_20 = *(undefined8 *)hDevice;
    uVar2 = SUB168(ZEXT416(metricGroupCount) * ZEXT816(8),0);
    if (SUB168(ZEXT416(metricGroupCount) * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    p_Stack_40 = hNotificationEvent;
    hNotificationEvent_local = (ze_event_handle_t)desc;
    desc_local = (zet_metric_tracer_exp_desc_t *)phMetricGroups;
    phMetricGroups_local._4_4_ = metricGroupCount;
    pvVar3 = operator_new__(uVar2);
    for (local_68 = 0;
        desc_local != (zet_metric_tracer_exp_desc_t *)0x0 && local_68 < phMetricGroups_local._4_4_;
        local_68 = local_68 + 1) {
      *(undefined8 *)((long)pvVar3 + local_68 * 8) = **(undefined8 **)(desc_local + local_68 * 8);
    }
    if (p_Stack_40 == (ze_event_handle_t)0x0) {
      local_90 = 0;
    }
    else {
      local_90 = *(undefined8 *)p_Stack_40;
    }
    p_Stack_40 = (ze_event_handle_t)local_90;
    dditable._4_4_ =
         (*pcVar1)(hDevice_local,uStack_20,phMetricGroups_local._4_4_,pvVar3,
                   hNotificationEvent_local,local_90,phMetricTracer);
    if (pvVar3 != (void *)0x0) {
      operator_delete__(pvVar3);
    }
    if (dditable._4_4_ == ZE_RESULT_SUCCESS) {
      poVar4 = singleton_factory_t<object_t<_zet_metric_tracer_exp_handle_t*>,_zet_metric_tracer_exp_handle_t*>
               ::getInstance<_zet_metric_tracer_exp_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_zet_metric_tracer_exp_handle_t*>,_zet_metric_tracer_exp_handle_t*>
                           *)(context + 0x13e0),phMetricTracer,(dditable_t **)&pfnCreateExp);
      *phMetricTracer = (zet_metric_tracer_exp_handle_t)poVar4;
      hContext_local._4_4_ = dditable._4_4_;
    }
    else {
      hContext_local._4_4_ = dditable._4_4_;
    }
  }
  return hContext_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricTracerCreateExp(
        zet_context_handle_t hContext,                  ///< [in] handle of the context object
        zet_device_handle_t hDevice,                    ///< [in] handle of the device
        uint32_t metricGroupCount,                      ///< [in] metric group count
        zet_metric_group_handle_t* phMetricGroups,      ///< [in][range(0, metricGroupCount )] handles of the metric groups to
                                                        ///< trace
        zet_metric_tracer_exp_desc_t* desc,             ///< [in,out] metric tracer descriptor
        ze_event_handle_t hNotificationEvent,           ///< [in][optional] event used for report availability notification. Note:
                                                        ///< If buffer is not drained when the event it flagged, there is a risk of
                                                        ///< HW event buffer being overrun
        zet_metric_tracer_exp_handle_t* phMetricTracer  ///< [out] handle of the metric tracer
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zet_context_object_t*>( hContext )->dditable;
        auto pfnCreateExp = dditable->zet.MetricTracerExp.pfnCreateExp;
        if( nullptr == pfnCreateExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hContext = reinterpret_cast<zet_context_object_t*>( hContext )->handle;

        // convert loader handle to driver handle
        hDevice = reinterpret_cast<zet_device_object_t*>( hDevice )->handle;

        // convert loader handles to driver handles
        auto phMetricGroupsLocal = new zet_metric_group_handle_t [metricGroupCount ];
        for( size_t i = 0; ( nullptr != phMetricGroups ) && ( i < metricGroupCount  ); ++i )
            phMetricGroupsLocal[ i ] = reinterpret_cast<zet_metric_group_object_t*>( phMetricGroups[ i ] )->handle;

        // convert loader handle to driver handle
        hNotificationEvent = ( hNotificationEvent ) ? reinterpret_cast<ze_event_object_t*>( hNotificationEvent )->handle : nullptr;

        // forward to device-driver
        result = pfnCreateExp( hContext, hDevice, metricGroupCount, phMetricGroupsLocal, desc, hNotificationEvent, phMetricTracer );
        delete []phMetricGroupsLocal;

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phMetricTracer = reinterpret_cast<zet_metric_tracer_exp_handle_t>(
                context->zet_metric_tracer_exp_factory.getInstance( *phMetricTracer, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }